

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void plot_masked_sprite_24px(tgestate_t *state,vischar_t *vischar)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  byte *pbVar8;
  ulong uVar9;
  byte bVar10;
  ushort uVar11;
  uint8_t uVar12;
  long lVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  
  uVar11 = (vischar->isopos).x;
  uVar7 = uVar11 & 7;
  if (uVar7 < 4) {
    uVar11 = uVar11 & 3;
    puVar1 = state->bitmap_pointer;
    puVar2 = state->mask_pointer;
    uVar12 = (state->spriteplotter).height_24_right;
    lVar13 = 0;
    do {
      bVar5 = puVar1[lVar13];
      bVar20 = puVar1[lVar13 + 1];
      bVar16 = puVar1[lVar13 + 2];
      bVar10 = puVar2[lVar13];
      bVar21 = puVar2[lVar13 + 1];
      bVar6 = puVar2[lVar13 + 2];
      if ((char)state->sprite_index < '\0') {
        uVar4 = (ulong)bVar5;
        uVar9 = (ulong)bVar10;
        bVar10 = state->reversed[bVar6];
        bVar6 = state->reversed[uVar9];
        bVar21 = state->reversed[bVar21];
        bVar5 = state->reversed[bVar16];
        bVar16 = state->reversed[uVar4];
        bVar20 = state->reversed[bVar20];
      }
      if (uVar11 == 3) {
        bVar15 = bVar5 << 7;
        bVar18 = bVar20 << 7;
        bVar5 = bVar5 >> 1;
        uVar4 = (ulong)(byte)(bVar16 << 7);
        bVar20 = bVar15 | bVar20 >> 1;
        bVar16 = bVar18 | bVar16 >> 1;
      }
      else {
        uVar4 = 0;
      }
      bVar15 = bVar5;
      bVar18 = bVar20;
      bVar19 = bVar16;
      if ((uVar11 ^ 2) < 2) {
        bVar15 = bVar5 >> 1;
        bVar18 = bVar5 << 7 | bVar20 >> 1;
        bVar19 = bVar20 << 7 | bVar16 >> 1;
        uVar4 = (ulong)(byte)(bVar16 << 7 | (byte)(uVar4 >> 1));
      }
      bVar14 = (byte)uVar4;
      bVar5 = bVar15;
      bVar16 = bVar18;
      bVar20 = bVar19;
      if (uVar11 != 0) {
        bVar5 = bVar15 >> 1;
        bVar16 = bVar15 << 7 | bVar18 >> 1;
        bVar20 = bVar18 << 7 | bVar19 >> 1;
        bVar14 = bVar19 << 7 | (byte)(uVar4 >> 1);
      }
      bVar17 = 0xff;
      bVar15 = bVar10;
      bVar18 = bVar21;
      bVar19 = bVar6;
      if (uVar11 == 3) {
        bVar15 = bVar10 >> 1 | 0x80;
        bVar18 = bVar10 << 7 | bVar21 >> 1;
        bVar19 = bVar21 << 7 | bVar6 >> 1;
        bVar17 = bVar6 << 7 | 0x7f;
      }
      bVar6 = bVar15;
      bVar21 = bVar18;
      bVar10 = bVar19;
      if ((uVar11 ^ 2) < 2) {
        bVar6 = bVar15 >> 1 | 0x80;
        bVar21 = bVar15 << 7 | bVar18 >> 1;
        bVar10 = bVar18 << 7 | bVar19 >> 1;
        bVar17 = bVar17 >> 1 | bVar19 << 7;
      }
      bVar15 = bVar6;
      bVar18 = bVar21;
      bVar19 = bVar10;
      if (uVar11 != 0) {
        bVar15 = bVar6 >> 1 | 0x80;
        bVar18 = bVar6 << 7 | bVar21 >> 1;
        bVar19 = bVar21 << 7 | bVar10 >> 1;
        bVar17 = bVar17 >> 1 | bVar10 << 7;
      }
      pbVar8 = state->window_buf_pointer;
      pbVar3 = state->foreground_mask_pointer;
      if ((state->spriteplotter).enable_24_right_1 != '\0') {
        *pbVar8 = bVar5 & *pbVar3 | (bVar15 | ~*pbVar3) & *pbVar8;
      }
      if ((state->spriteplotter).enable_24_right_2 != '\0') {
        pbVar8[1] = bVar16 & pbVar3[1] | (bVar18 | ~pbVar3[1]) & pbVar8[1];
      }
      if ((state->spriteplotter).enable_24_right_3 != '\0') {
        pbVar8[2] = bVar20 & pbVar3[2] | (bVar19 | ~pbVar3[2]) & pbVar8[2];
      }
      pbVar8 = pbVar8 + 3;
      if ((state->spriteplotter).enable_24_right_4 != '\0') {
        *pbVar8 = bVar14 & pbVar3[3] | (bVar17 | ~pbVar3[3]) & *pbVar8;
      }
      state->foreground_mask_pointer = pbVar3 + 4;
      state->window_buf_pointer = pbVar8 + (long)state->columns + -3;
      lVar13 = lVar13 + 3;
      uVar12 = uVar12 + 0xff;
    } while (uVar12 != '\0');
  }
  else {
    puVar1 = state->bitmap_pointer;
    puVar2 = state->mask_pointer;
    uVar12 = (state->spriteplotter).height_24_left;
    uVar11 = uVar7 + 0xfc & 0xff;
    lVar13 = 0;
    do {
      bVar10 = puVar1[lVar13];
      bVar16 = puVar1[lVar13 + 1];
      bVar20 = puVar1[lVar13 + 2];
      bVar21 = puVar2[lVar13];
      bVar6 = puVar2[lVar13 + 1];
      bVar5 = puVar2[lVar13 + 2];
      if ((char)state->sprite_index < '\0') {
        uVar4 = (ulong)bVar10;
        uVar9 = (ulong)bVar21;
        bVar21 = state->reversed[bVar5];
        bVar5 = state->reversed[uVar9];
        bVar6 = state->reversed[bVar6];
        bVar10 = state->reversed[bVar20];
        bVar20 = state->reversed[uVar4];
        bVar16 = state->reversed[bVar16];
      }
      if (uVar11 == 0) {
        bVar15 = bVar20 * '\x02';
        bVar18 = bVar16 * '\x02' | bVar20 >> 7;
        bVar19 = bVar10 >> 7;
        bVar10 = bVar10 * '\x02' | bVar16 >> 7;
      }
      else {
        bVar19 = 0;
        bVar18 = bVar16;
        bVar15 = bVar20;
      }
      bVar20 = bVar10;
      bVar14 = bVar18;
      bVar16 = bVar15;
      if (uVar11 < 2) {
        bVar16 = bVar15 * '\x02';
        bVar14 = bVar18 * '\x02' | bVar15 >> 7;
        bVar20 = bVar10 * '\x02' | bVar18 >> 7;
        bVar19 = bVar19 * '\x02' | bVar10 >> 7;
      }
      bVar15 = bVar20;
      bVar18 = bVar14;
      bVar10 = bVar16;
      if (uVar11 < 3) {
        bVar10 = bVar16 * '\x02';
        bVar18 = bVar14 * '\x02' | bVar16 >> 7;
        bVar15 = bVar20 * '\x02' | bVar14 >> 7;
        bVar19 = bVar19 * '\x02' | bVar20 >> 7;
      }
      bVar14 = 0xff;
      bVar16 = bVar6;
      bVar20 = bVar5;
      if (uVar11 == 0) {
        bVar20 = bVar5 * '\x02' + 1;
        bVar16 = bVar6 * '\x02' | bVar5 >> 7;
        bVar14 = bVar21 >> 7;
        bVar21 = bVar21 * '\x02' | bVar6 >> 7;
        bVar14 = bVar14 | 0xfe;
      }
      bVar5 = bVar21;
      bVar6 = bVar16;
      bVar17 = bVar20;
      if (uVar11 < 2) {
        bVar17 = bVar20 * '\x02' + 1;
        bVar6 = bVar16 * '\x02' | bVar20 >> 7;
        bVar5 = bVar21 * '\x02' | bVar16 >> 7;
        bVar14 = bVar14 * '\x02' | bVar21 >> 7;
      }
      bVar21 = bVar5;
      bVar16 = bVar6;
      bVar20 = bVar17;
      if (uVar11 < 3) {
        bVar20 = bVar17 * '\x02' + 1;
        bVar16 = bVar6 * '\x02' | bVar17 >> 7;
        bVar21 = bVar5 * '\x02' | bVar6 >> 7;
        bVar14 = bVar14 * '\x02' | bVar5 >> 7;
      }
      pbVar8 = state->window_buf_pointer;
      pbVar3 = state->foreground_mask_pointer;
      if ((state->spriteplotter).enable_24_left_1 != '\0') {
        *pbVar8 = (bVar19 * '\x02' | bVar15 >> 7) & *pbVar3 |
                  (~*pbVar3 | bVar14 * '\x02' | bVar21 >> 7) & *pbVar8;
      }
      if ((state->spriteplotter).enable_24_left_2 != '\0') {
        pbVar8[1] = (bVar15 * '\x02' | bVar18 >> 7) & pbVar3[1] |
                    (~pbVar3[1] | bVar21 * '\x02' | bVar16 >> 7) & pbVar8[1];
      }
      if ((state->spriteplotter).enable_24_left_3 != '\0') {
        pbVar8[2] = (bVar18 * '\x02' | bVar10 >> 7) & pbVar3[2] |
                    (~pbVar3[2] | bVar16 * '\x02' | bVar20 >> 7) & pbVar8[2];
      }
      pbVar8 = pbVar8 + 3;
      if ((state->spriteplotter).enable_24_left_4 != '\0') {
        *pbVar8 = bVar10 * '\x02' & pbVar3[3] | (~pbVar3[3] | bVar20 * '\x02' | 1) & *pbVar8;
      }
      state->foreground_mask_pointer = pbVar3 + 4;
      state->window_buf_pointer = pbVar8 + (long)state->columns + -3;
      lVar13 = lVar13 + 3;
      uVar12 = uVar12 + 0xff;
    } while (uVar12 != '\0');
  }
  return;
}

Assistant:

void plot_masked_sprite_24px(tgestate_t *state, vischar_t *vischar)
{
  uint8_t        x;           /* was A */
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  if ((x = (vischar->isopos.x & 7)) < 4)
  {
    /* Shift right */

    x = ~x & 3; /* jump table offset (on input, x is 0..3) */

    maskptr   = state->mask_pointer;
    bitmapptr = state->bitmap_pointer;

    assert(maskptr   != NULL);
    assert(bitmapptr != NULL);

    iters = state->spriteplotter.height_24_right;
    assert(iters <= MASK_BUFFER_HEIGHT * 8);
    do
    {
      uint8_t bm0, bm1, bm2, bm3;         /* was B, C, E, D */
      uint8_t mask0, mask1, mask2, mask3; /* was B', C', E', D' */
      int     carry = 0;                  /* was flags */

      /* Load bitmap bytes into B,C,E. */
      bm0 = *bitmapptr++;
      bm1 = *bitmapptr++;
      bm2 = *bitmapptr++;

      /* Load mask bytes into B',C',E'. */
      mask0 = *maskptr++;
      mask1 = *maskptr++;
      mask2 = *maskptr++;

      if (state->sprite_index & sprite_FLAG_FLIP)
        flip_24_masked_pixels(state, &mask2, &mask1, &mask0, &bm2, &bm1, &bm0);

      foremaskptr = state->foreground_mask_pointer;
      screenptr   = state->window_buf_pointer; /* Conv: Moved compared to the other routines. */

      ASSERT_MASK_BUF_PTR_VALID(foremaskptr);
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);

      /* Shift bitmap */

      bm3 = 0;
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        SRL(bm0);
        RR(bm1);
        RR(bm2);
        RR(bm3);
      }
      if (x <= 1)
      {
        SRL(bm0);
        RR(bm1);
        RR(bm2);
        RR(bm3);
      }
      if (x <= 2)
      {
        SRL(bm0);
        RR(bm1);
        RR(bm2);
        RR(bm3);
      }

      /* Shift mask */

      mask3 = 0xFF;
      carry = 1;
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        RR(mask0);
        RR(mask1);
        RR(mask2);
        RR(mask3);
      }
      if (x <= 1)
      {
        RR(mask0);
        RR(mask1);
        RR(mask2);
        RR(mask3);
      }
      if (x <= 2)
      {
        RR(mask0);
        RR(mask1);
        RR(mask2);
        RR(mask3);
      }

      /* Plot, using foreground mask. */

      /* Conv: We form 'mask' inside of the enable_* condition. The original
       * game got away with accessing out-of-bounds memory but we can't. */

      if (state->spriteplotter.enable_24_right_1)
        *screenptr = MASK(bm0, mask0);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_right_2)
        *screenptr = MASK(bm1, mask1);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_right_3)
        *screenptr = MASK(bm2, mask2);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_right_4)
        *screenptr = MASK(bm3, mask3);
      foremaskptr++;
      state->foreground_mask_pointer = foremaskptr;

      screenptr += state->columns - 3; /* was 21 */
      if (iters > 1)
        ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);
      state->window_buf_pointer = screenptr;
    }
    while (--iters);
  }
  else
  {
    /* Shift left */

    x -= 4; /* jump table offset (on input, x is 4..7) */

    maskptr   = state->mask_pointer;
    bitmapptr = state->bitmap_pointer;

    assert(maskptr   != NULL);
    assert(bitmapptr != NULL);

    iters = state->spriteplotter.height_24_left;
    assert(iters <= MASK_BUFFER_HEIGHT * 8);
    do
    {
      /* Note the different variable order to the case above. */
      uint8_t bm0, bm1, bm2, bm3;         /* was E, C, B, D */
      uint8_t mask0, mask1, mask2, mask3; /* was E', C', B', D' */
      int     carry = 0;

      /* Load bitmap bytes into B,C,E. */
      bm2 = *bitmapptr++;
      bm1 = *bitmapptr++;
      bm0 = *bitmapptr++;

      /* Load mask bytes into B',C',E'. */
      mask2 = *maskptr++;
      mask1 = *maskptr++;
      mask0 = *maskptr++;

      if (state->sprite_index & sprite_FLAG_FLIP)
        flip_24_masked_pixels(state, &mask0, &mask1, &mask2, &bm0, &bm1, &bm2);

      foremaskptr = state->foreground_mask_pointer;
      screenptr   = state->window_buf_pointer;

      ASSERT_MASK_BUF_PTR_VALID(foremaskptr);
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);

      /* Shift bitmap bytes */

      bm3 = 0;
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }
      if (x <= 1)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }
      if (x <= 2)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }
      if (x <= 3)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }

      /* Shift mask bytes */

      mask3 = 0xFF; /* all bits set => mask off */
      carry = 1; /* mask off */
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }
      if (x <= 1)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }
      if (x <= 2)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }
      if (x <= 3)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }

      /* Plot, using foreground mask. */

      /* Conv: We form 'mask' inside of the enable_* condition. The original
       * game got away with accessing out-of-bounds memory but we can't. */

      if (state->spriteplotter.enable_24_left_1)
        *screenptr = MASK(bm3, mask3);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_left_2)
        *screenptr = MASK(bm2, mask2);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_left_3)
        *screenptr = MASK(bm1, mask1);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_left_4)
        *screenptr = MASK(bm0, mask0);
      foremaskptr++;
      state->foreground_mask_pointer = foremaskptr;

      screenptr += state->columns - 3; /* was 21 */
      if (iters > 1)
        ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);
      state->window_buf_pointer = screenptr;
    }
    while (--iters);
  }
}